

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extendable_data_dictionary.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
          (ExtendableDataDictionary *this,FieldDef *field_def)

{
  bool bVar1;
  invalid_argument *this_00;
  optional<bidfx_public_api::price::pixie::FieldDef> previous;
  string local_70 [32];
  undefined1 local_50 [48];
  
  FieldDef::FieldDef((FieldDef *)local_50,field_def);
  bVar1 = DataDictionaryUtils::IsValid((FieldDef *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  if (bVar1) {
    if ((this->field_defs_by_fid_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      (**(this->super_IDataDictionary)._vptr_IDataDictionary)
                (&previous,this,(ulong)(uint)field_def->fid_);
      if (previous.super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>.
          _M_payload.
          super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
          super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged == true)
      {
        HandleDuplicatedFid(this,(FieldDef *)&previous);
      }
      std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
                ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)&previous);
    }
    std::
    _Rb_tree<int,std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
    ::_M_emplace_unique<int&,bidfx_public_api::price::pixie::FieldDef&>
              ((_Rb_tree<int,std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<int>,std::allocator<std::pair<int_const,bidfx_public_api::price::pixie::FieldDef>>>
                *)&this->field_defs_by_fid_,&field_def->fid_,field_def);
    if ((this->field_def_by_name_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::string::string(local_70,(string *)&field_def->name_);
      (*(this->super_IDataDictionary)._vptr_IDataDictionary[1])(&previous,this,local_70);
      std::__cxx11::string::~string(local_70);
      if (previous.super__Optional_base<bidfx_public_api::price::pixie::FieldDef,_false,_false>.
          _M_payload.
          super__Optional_payload<bidfx_public_api::price::pixie::FieldDef,_true,_false,_false>.
          super__Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>._M_engaged == true)
      {
        HandleDuplicatedName(this,(FieldDef *)&previous);
      }
      std::_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef>::_M_reset
                ((_Optional_payload_base<bidfx_public_api::price::pixie::FieldDef> *)&previous);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
    ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::pixie::FieldDef&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::pixie::FieldDef>>>
                *)&this->field_def_by_name_,&field_def->name_,field_def);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid field def added to dictionary");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ExtendableDataDictionary::AddFieldDef(FieldDef field_def)
{
    if (!DataDictionaryUtils::IsValid(field_def))
    {
        throw std::invalid_argument("invalid field def added to dictionary");
    }

    if (!field_defs_by_fid_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByFid(field_def.fid_);
        if (previous)
        {
            HandleDuplicatedFid(*previous);
        }
    }
    field_defs_by_fid_.emplace(field_def.fid_, field_def);
    if (!field_def_by_name_.empty())
    {
        std::optional<FieldDef> previous = FieldDefByName(field_def.name_);
        if (previous)
        {
            HandleDuplicatedName(*previous);
        }
    }
    field_def_by_name_.emplace(field_def.name_, field_def);
}